

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# softfloat.c
# Opt level: O1

float32 float32_mul_x86_64(float32 a,float32 b,float_status *s)

{
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  union_float32 ub;
  uint uVar5;
  union_float32 ua;
  uint uVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  bool bVar11;
  float fVar12;
  FloatParts FVar13;
  FloatParts FVar14;
  FloatParts p;
  
  uVar2 = (ulong)a;
  uVar1 = (ulong)b;
  if (((s->float_exception_flags & 0x20) != 0) && (s->float_rounding_mode == '\0')) {
    if (s->flush_inputs_to_zero != '\0') {
      if ((a & 0x7fffffff) != 0 && (a & 0x7f800000) == 0) {
        uVar2 = (ulong)(a & 0x80000000);
        s->float_exception_flags = s->float_exception_flags | 0x40;
      }
      if ((b & 0x7fffffff) != 0 && (b & 0x7f800000) == 0) {
        uVar1 = (ulong)(b & 0x80000000);
        s->float_exception_flags = s->float_exception_flags | 0x40;
      }
    }
    b = (float32)uVar1;
    if ((((uVar2 & 0x7fffffff) == 0) || (((int)(uVar2 >> 0x17) + 1U & 0xfe) != 0)) &&
       (((uVar1 & 0x7fffffff) == 0 || (((int)(uVar1 >> 0x17) + 1U & 0xfe) != 0)))) {
      if ((uVar2 & 0x7fffffff) == 0 || (uVar1 & 0x7fffffff) == 0) {
        return (b ^ (uint)(float)uVar2) & 0x80000000;
      }
      fVar12 = (float)b * (float)uVar2;
      if (ABS(fVar12) == INFINITY) {
        s->float_exception_flags = s->float_exception_flags | 8;
        return (float32)fVar12;
      }
      if (1.1754944e-38 < ABS(fVar12)) {
        return (float32)fVar12;
      }
    }
  }
  FVar13._8_8_ = (ulong)((uint)(uVar2 >> 0x17) & 0xff) | (ulong)((uint)uVar2 & 0x80000000) << 9;
  FVar13.frac = (ulong)((uint)uVar2 & 0x7fffff);
  FVar13 = sf_canonicalize(FVar13,&float32_params,s);
  uVar10 = FVar13._8_8_;
  uVar1 = FVar13.frac;
  FVar14._8_8_ = (ulong)(b >> 0x17 & 0xff) | (ulong)(b & 0x80000000) << 9;
  FVar14.frac = (ulong)(b & 0x7fffff);
  FVar14 = sf_canonicalize(FVar14,&float32_params,s);
  uVar3 = FVar14._8_8_;
  uVar2 = FVar14.frac;
  uVar4 = (uVar3 ^ uVar10) & 0x10000000000;
  uVar6 = FVar13._12_4_ & 0xff;
  uVar5 = FVar14._12_4_ & 0xff;
  if ((uVar6 == 2) && (uVar5 == 2)) {
    uVar7 = (uVar1 & 0xffffffff) * (uVar2 >> 0x20);
    uVar8 = (ulong)(uint)FVar14.frac * (uVar1 >> 0x20);
    uVar9 = uVar8 + uVar7;
    uVar3 = uVar2 * uVar1;
    uVar2 = ((uVar9 >> 0x20) + (uVar2 >> 0x20) * (uVar1 >> 0x20) +
             ((ulong)CARRY8(uVar8,uVar7) << 0x20) + (ulong)(uVar3 < uVar9 << 0x20)) * 4;
    uVar7 = uVar2 | uVar3 >> 0x3e;
    bVar11 = (uVar3 & 0x3fffffffffffffff) != 0;
    uVar1 = (ulong)((uint)bVar11 | (uint)uVar7 & 1) | uVar7 >> 1;
    if (-1 < (long)uVar7) {
      uVar1 = bVar11 | uVar7;
    }
    uVar10 = uVar10 & 0xffff00ff00000000 |
             (ulong)(uint)((FVar14.exp + FVar13.exp) - (int)((long)uVar2 >> 0x3f));
  }
  else {
    if (((uVar10 | uVar3) & 0xfc00000000) != 0) {
      p = pick_nan(FVar13,FVar14,s);
      goto LAB_004e0989;
    }
    if (((uVar6 == 3) && (uVar5 == 1)) || ((uVar6 == 1 && (uVar5 == 3)))) {
      s->float_exception_flags = s->float_exception_flags | 1;
      p.exp = 0x7fffffff;
      p.cls = float_class_qnan;
      p.sign = true;
      p._14_2_ = 0;
      p.frac = 0x2000000000000000;
      goto LAB_004e0989;
    }
    if ((uVar6 | 2) != 3) {
      if ((uVar5 | 2) != 3) {
        g_assertion_message_expr
                  ("/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/fpu/softfloat.c"
                   ,0x4e6,(char *)0x0);
      }
      uVar4 = uVar4 | uVar3 & 0xffff0003ffffffff;
      p.exp = (int)uVar4;
      p.cls = (char)(uVar4 >> 0x20);
      p.sign = (_Bool)(char)(uVar4 >> 0x28);
      p._14_2_ = (short)(uVar4 >> 0x30);
      p.frac = uVar2;
      goto LAB_004e0989;
    }
    uVar10 = uVar10 & 0xffff0003ffffffff;
  }
  uVar10 = uVar10 | uVar4;
  p.exp = (int)uVar10;
  p.cls = (char)(uVar10 >> 0x20);
  p.sign = (_Bool)(char)(uVar10 >> 0x28);
  p._14_2_ = (short)(uVar10 >> 0x30);
  p.frac = uVar1;
LAB_004e0989:
  FVar13 = round_canonical(p,s,&float32_params);
  return (uint)FVar13.frac & 0x7fffff | (FVar13.exp & 0xffU) << 0x17 |
         (uint)(FVar13._8_8_ >> 9) & 0x80000000;
}

Assistant:

static inline bool can_use_fpu(const float_status *s)
{
    if (QEMU_NO_HARDFLOAT) {
        return false;
    }
    return likely(s->float_exception_flags & float_flag_inexact &&
                  s->float_rounding_mode == float_round_nearest_even);
}